

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::DGXMLScanner::scanStartTag(DGXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  XMLBuffer *pXVar1;
  ElemStack *this_01;
  XMLSize_t XVar2;
  Grammar *pGVar3;
  XMLValidator *pXVar4;
  ulong uVar5;
  XMLCh *newValue;
  XMLDocumentHandler *pXVar6;
  bool bVar7;
  XMLCh XVar8;
  int iVar9;
  undefined4 extraout_var;
  DTDElementDecl *this_02;
  DTDAttDef *attDef;
  XMLAttr *this_03;
  uint *puVar10;
  XMLCh *pXVar11;
  undefined4 extraout_var_00;
  XMLCh *text2;
  XMLSize_t XVar12;
  undefined4 extraout_var_01;
  XMLCh *pXVar13;
  UnexpectedEOFException *this_04;
  ulong attCount;
  uint uVar14;
  bool *local_88;
  XMLSize_t failure;
  
  *gotData = true;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  pXVar1 = &(this->super_XMLScanner).fQNameBuf;
  bVar7 = ReaderMgr::getName(this_00,pXVar1);
  if (!bVar7) {
    XVar2 = pXVar1->fIndex;
    if (XVar2 == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    }
    else {
      pXVar13 = (this->super_XMLScanner).fQNameBuf.fBuffer;
      pXVar13[XVar2] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidElementName,pXVar13,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    ReaderMgr::skipToChar(this_00,L'<');
    return false;
  }
  XVar2 = (this->super_XMLScanner).fElemStack.fStackTop;
  pXVar13 = (this->super_XMLScanner).fQNameBuf.fBuffer;
  pXVar13[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
  pGVar3 = (this->super_XMLScanner).fGrammar;
  iVar9 = (*(pGVar3->super_XSerializable)._vptr_XSerializable[0xb])
                    (pGVar3,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0);
  this_02 = (DTDElementDecl *)CONCAT44(extraout_var,iVar9);
  if ((this_02 == (DTDElementDecl *)0x0) &&
     (this_02 = NameIdPool<xercesc_4_0::DTDElementDecl>::getByKey(this->fDTDElemNonDeclPool,pXVar13)
     , this_02 == (DTDElementDecl *)0x0)) {
    this_02 = (DTDElementDecl *)XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
    DTDElementDecl::DTDElementDecl
              (this_02,pXVar13,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fMemoryManager);
    XVar12 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_02);
    (this_02->super_XMLElementDecl).fId = XVar12;
    if ((this->super_XMLScanner).fValidate == false) goto LAB_0029f030;
    (this_02->super_XMLElementDecl).fCreateReason = JustFaultIn;
LAB_0029f006:
    XMLValidator::emitError
              ((this->super_XMLScanner).fValidator,ElementNotDefined,pXVar13,(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0);
  }
  else {
    if ((this->super_XMLScanner).fValidate == false) goto LAB_0029f030;
    if ((this_02->super_XMLElementDecl).fCreateReason != Declared) goto LAB_0029f006;
  }
  pXVar4 = (this->super_XMLScanner).fValidator;
  (*pXVar4->_vptr_XMLValidator[9])(pXVar4,this_02);
LAB_0029f030:
  local_88 = &(this->super_XMLScanner).fValidate;
  this_01 = &(this->super_XMLScanner).fElemStack;
  ElemStack::addLevel(this_01,&this_02->super_XMLElementDecl,
                      ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum);
  if (XVar2 == 0) {
    (this->super_XMLScanner).fRootGrammar = (this->super_XMLScanner).fGrammar;
    if ((((this->super_XMLScanner).fValidate == true) &&
        (pXVar11 = (this->super_XMLScanner).fRootElemName, pXVar11 != (XMLCh *)0x0)) &&
       (bVar7 = XMLString::equals(pXVar13,pXVar11), !bVar7)) {
      XMLValidator::emitError((this->super_XMLScanner).fValidator,RootElemNotLikeDocType);
    }
  }
  else if (*local_88 == true) {
    ElemStack::addChild(this_01,(this_02->super_XMLElementDecl).fElementName,true);
  }
  ReaderMgr::skipPastSpaces(this_00);
  uVar5 = (((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).
          fCurCount;
  this->fElemCount = this->fElemCount + 1;
  pXVar1 = &(this->super_XMLScanner).fAttNameBuf;
  attCount = 0;
LAB_0029f0f6:
  do {
    while( true ) {
      XVar8 = ReaderMgr::peekNextChar(this_00);
      if (((attCount != 0) && (XVar8 != L'/')) && (XVar8 != L'>')) {
        if ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)XVar8]
            < '\0') {
          ReaderMgr::skipPastSpaces(this_00);
          XVar8 = ReaderMgr::peekNextChar(this_00);
        }
        else {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
        }
      }
      uVar14 = (uint)(ushort)XVar8;
      if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[uVar14] & 0x10) == 0)
      break;
      if ((XVar8 == L'\"') || (uVar14 == 0x27)) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        ReaderMgr::getNextChar(this_00);
        ReaderMgr::skipQuotedString(this_00,XVar8);
        ReaderMgr::skipPastSpaces(this_00);
      }
      else {
        if (uVar14 == 0x2f) {
          ReaderMgr::getNextChar(this_00);
          bVar7 = ReaderMgr::skippedChar(this_00,L'>');
          uVar14 = 1;
          if (bVar7) goto LAB_0029f585;
          pXVar11 = XMLElementDecl::getFullName(&this_02->super_XMLElementDecl);
LAB_0029f56d:
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar11,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
LAB_0029f585:
          if (attCount != 0) {
            Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
          }
          XVar12 = buildAttList(this,attCount,&this_02->super_XMLElementDecl,
                                (this->super_XMLScanner).fAttrList);
          pXVar6 = (this->super_XMLScanner).fDocHandler;
          if (pXVar6 != (XMLDocumentHandler *)0x0) {
            (*pXVar6->_vptr_XMLDocumentHandler[0xb])
                      (pXVar6,this_02,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,
                       (this->super_XMLScanner).fAttrList,XVar12,(ulong)uVar14,(ulong)(XVar2 == 0));
          }
          if ((char)uVar14 != '\0') {
            if ((*local_88 == true) &&
               (pXVar4 = (this->super_XMLScanner).fValidator,
               iVar9 = (*pXVar4->_vptr_XMLValidator[2])(pXVar4,this_02,0,0), (char)iVar9 == '\0')) {
              pXVar4 = (this->super_XMLScanner).fValidator;
              iVar9 = (*(this_02->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd]
                      )(this_02);
              XMLValidator::emitError
                        (pXVar4,ElementNotValidForContent,pXVar13,
                         (XMLCh *)CONCAT44(extraout_var_01,iVar9),(XMLCh *)0x0,(XMLCh *)0x0);
            }
            ElemStack::popTop(this_01);
            if (XVar2 == 0) {
              *gotData = false;
              return true;
            }
            return true;
          }
          return true;
        }
        if (uVar14 == 0x3c) {
          pXVar11 = XMLElementDecl::getFullName(&this_02->super_XMLElementDecl);
          uVar14 = 0;
          goto LAB_0029f56d;
        }
        if (uVar14 == 0x3e) {
          ReaderMgr::getNextChar(this_00);
          uVar14 = 0;
          goto LAB_0029f585;
        }
        if (uVar14 == 0) {
          this_04 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
          UnexpectedEOFException::UnexpectedEOFException
                    (this_04,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                     ,0x582,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
          __cxa_throw(this_04,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
        }
      }
    }
    bVar7 = ReaderMgr::getName(this_00,pXVar1);
    if (!bVar7) {
      XVar2 = pXVar1->fIndex;
      if (XVar2 == 0) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
      }
      else {
        pXVar13 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
        pXVar13[XVar2] = L'\0';
        XMLScanner::emitError
                  (&this->super_XMLScanner,InvalidAttrName,pXVar13,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      ReaderMgr::skipPastChar(this_00,L'>');
      return false;
    }
    bVar7 = XMLScanner::scanEq(&this->super_XMLScanner,false);
    if (!bVar7) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
      XVar8 = ReaderMgr::skipUntilInOrWS(this_00,L"\'\"></");
      if ((XVar8 == L'/') || (XVar8 == L'>')) goto LAB_0029f0f6;
      if ((XVar8 != L'\"') &&
         ((XVar8 != L'\'' &&
          (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                      [(ushort)XVar8])))) goto joined_r0x0029f681;
    }
    pXVar11 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
    pXVar11[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
    attDef = DTDElementDecl::getAttDef(this_02,pXVar11);
    ReaderMgr::skipPastSpaces(this_00);
    bVar7 = scanAttValue(this,&attDef->super_XMLAttDef,pXVar11,
                         &(this->super_XMLScanner).fAttValueBuf);
    if (!bVar7) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
      XVar8 = ReaderMgr::skipUntilInOrWS(this_00,L"></");
      if (((XVar8 != L'/') && (XVar8 != L'>')) &&
         (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                     [(ushort)XVar8])) {
joined_r0x0029f681:
        if (XVar8 != L'<') {
          return false;
        }
        pXVar13 = XMLElementDecl::getFullName(&this_02->super_XMLElementDecl);
        XMLScanner::emitError
                  (&this->super_XMLScanner,UnterminatedStartTag,pXVar13,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        return false;
      }
    }
    newValue = (this->super_XMLScanner).fAttValueBuf.fBuffer;
    newValue[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
    if (attCount < uVar5) {
      this_03 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&((this->super_XMLScanner).fAttrList)->
                            super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,attCount);
    }
    else {
      this_03 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
      XMLAttr::XMLAttr(this_03,(this->super_XMLScanner).fMemoryManager);
      BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
                (&((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
                 this_03);
    }
    this_03->fSpecified = true;
    if (attDef == (DTDAttDef *)0x0) {
      XMLAttr::set(this_03,0,pXVar11,L"",L"",AttTypes_Min,(DatatypeValidator *)0x0,false);
      pXVar11 = XMLAttr::getQName(this_03);
      bVar7 = Hash2KeysSetOf<xercesc_4_0::StringHasher>::putIfNotPresent
                        (this->fUndeclaredAttrRegistry,pXVar11,0);
      if (!bVar7) {
LAB_0029f42d:
        text2 = XMLElementDecl::getFullName(&this_02->super_XMLElementDecl);
        XMLScanner::emitError
                  (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar11,text2,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
    }
    else {
      XMLAttr::set(this_03,0,pXVar11,L"",L"",(attDef->super_XMLAttDef).fType,
                   (DatatypeValidator *)0x0,false);
      puVar10 = RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::get
                          (this->fAttDefRegistry,attDef);
      if (puVar10 == (uint *)0x0) {
        puVar10 = XMLScanner::getNewUIntPtr(&this->super_XMLScanner);
        *puVar10 = this->fElemCount;
        RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::put
                  (this->fAttDefRegistry,attDef,puVar10);
      }
      else {
        if (this->fElemCount <= *puVar10) {
          iVar9 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(attDef);
          pXVar11 = (XMLCh *)CONCAT44(extraout_var_00,iVar9);
          goto LAB_0029f42d;
        }
        *puVar10 = this->fElemCount;
      }
    }
    if (*local_88 == true) {
      pXVar4 = (this->super_XMLScanner).fValidator;
      if (attDef == (DTDAttDef *)0x0) {
        pXVar11 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
        pXVar11[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
        XMLValidator::emitError
                  (pXVar4,AttNotDefinedForElement,pXVar11,pXVar13,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      else {
        (this->super_XMLScanner).fAttValueBuf.fBuffer[(this->super_XMLScanner).fAttValueBuf.fIndex]
             = L'\0';
        (*pXVar4->_vptr_XMLValidator[8])();
      }
    }
    XMLAttr::setValue(this_03,newValue);
    attCount = attCount + 1;
  } while( true );
}

Assistant:

bool DGXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.

    bool validName = fReaderMgr.getName(fQNameBuf);
    if (!validName)
    {
        if (fQNameBuf.isEmpty())
            emitError(XMLErrs::ExpectedElementName);
        else
            emitError(XMLErrs::InvalidElementName, fQNameBuf.getRawBuffer());
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    //  Lets try to look up the element in the validator's element decl pool
    //  We can pass bogus values for the URI id and the base name. We know that
    //  this can only be called if we are doing a DTD style validator and that
    //  he will only look at the QName.
    //
    //  We *do not* tell him to fault in a decl if he does not find one - NG.
    bool wasAdded = false;
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();

    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        fEmptyNamespaceId
        , 0
        , qnameRawBuf
        , Grammar::TOP_LEVEL_SCOPE
    );
    // look in the undeclared pool:
    if(!elemDecl)
    {
        elemDecl = fDTDElemNonDeclPool->getByKey(qnameRawBuf);
    }
    if(!elemDecl)
    {
        wasAdded = true;
        elemDecl = new (fMemoryManager) DTDElementDecl
        (
            qnameRawBuf
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fMemoryManager
        );
        elemDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)elemDecl));
    }

    if (fValidate) {

        if (wasAdded)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the validator pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }
        // If its not marked declared, then emit an error
        else if (!elemDecl->isDeclared())
        {
            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }


        fValidator->validateElement(elemDecl);
    }

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());

    //  If this is the first element and we are validating, check the root
    //  element.
    if (isRoot)
    {
        fRootGrammar = fGrammar;

        if (fValidate)
        {
            //  If a DocType exists, then check if it matches the root name there.
            if (fRootElemName && !XMLString::equals(qnameRawBuf, fRootElemName))
                fValidator->emitError(XMLValid::RootElemNotLikeDocType);
        }
    }
    else if (fValidate)
    {
        //  If the element stack is not empty, then add this element as a
        //  child of the previous top element. If its empty, this is the root
        //  elem and is not the child of anything.
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    wasAdded = false;

    fElemCount++;

    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    // Ok, skip by them and peek another char
                    fReaderMgr.skipPastSpaces();
                    nextCh = fReaderMgr.peekNextChar();
                }
                 else
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.

            validName = fReaderMgr.getName(fAttNameBuf);
            if (!validName)
            {
                if (fAttNameBuf.isEmpty())
                    emitError(XMLErrs::ExpectedAttrName);
                else
                    emitError(XMLErrs::InvalidAttrName, fAttNameBuf.getRawBuffer());
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  See if this attribute is declared for this element. If we are
            //  not validating of course it will not be at first, but we will
            //  fault it into the pool (to avoid lots of redundant errors.)
            XMLCh * namePtr = fAttNameBuf.getRawBuffer();
            XMLAttDef* attDef = ((DTDElementDecl *)elemDecl)->getAttDef(namePtr);

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attDef, namePtr, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            // Note that we want to this first since this will
            // make a copy of the namePtr; we can then make use of
            // that copy in the hashtable lookup that checks
            // for duplicates.  This will mean we may have to update
            // the type of the XMLAttr later.
            XMLAttr* curAtt;
            const XMLCh* attrValue = fAttValueBuf.getRawBuffer();

            if (attCount >= curAttListSize) {
                curAtt = new (fMemoryManager) XMLAttr(fMemoryManager);
                fAttrList->addElement(curAtt);
            }
            else {
                curAtt = fAttrList->elementAt(attCount);
            }

            curAtt->setSpecified(true);

            // NO NAMESPACE CODE
            {
                curAtt->set(
                    0, namePtr, XMLUni::fgZeroLenString, XMLUni::fgZeroLenString
                    , (attDef)?attDef->getType():XMLAttDef::CData
                );

                // now need to prepare for duplicate detection
                if (attDef) {
                    unsigned int *curCountPtr = fAttDefRegistry->get(attDef);
                    if (!curCountPtr) {
                        curCountPtr = getNewUIntPtr();
                        *curCountPtr = fElemCount;
                        fAttDefRegistry->put(attDef, curCountPtr);
                    }
                    else if (*curCountPtr < fElemCount) {
                        *curCountPtr = fElemCount;
                    }
                    else {
                        emitError(
                            XMLErrs::AttrAlreadyUsedInSTag
                            , attDef->getFullName(), elemDecl->getFullName()
                        );
                    }
                }
                else
                {
                    // reset namePtr so it refers to newly-allocated memory
                    namePtr = (XMLCh *)curAtt->getQName();
                    if (!fUndeclaredAttrRegistry->putIfNotPresent(namePtr, 0))
                    {
                        emitError(
                            XMLErrs::AttrAlreadyUsedInSTag
                            , namePtr, elemDecl->getFullName()
                        );
                    }
                }
            }

            if (fValidate)
            {
                if (attDef) {
                    // Let the validator pass judgement on the attribute value
                    fValidator->validateAttrValue(
                        attDef, fAttValueBuf.getRawBuffer(), false, elemDecl
                    );
                }
                else
                {
                    fValidator->emitError
                    (
                        XMLValid::AttNotDefinedForElement
                        , fAttNameBuf.getRawBuffer(), qnameRawBuf
                    );
                }
            }

            // must set the newly-minted value on the XMLAttr:
            curAtt->setValue(attrValue);
            attCount++;

            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    //  Now lets get the fAttrList filled in. This involves faulting in any
    //  defaulted and fixed attributes and normalizing the values of any that
    //  we got explicitly.
    //
    //  We update the attCount value with the total number of attributes, but
    //  it goes in with the number of values we got during the raw scan of
    //  explictly provided attrs above.
    attCount = buildAttList(attCount, elemDecl, *fAttrList);

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    unsigned int uriId = fEmptyNamespaceId;
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl
            , uriId
            , 0
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , qnameRawBuf
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
    }

    return true;
}